

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokenizer::xlat_escape(CTcTokenizer *this,utf8_ptr *dst,utf8_ptr *p,wchar_t qu,int triple)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  utf8_ptr::inc(p);
  wVar1 = utf8_ptr::getch(p);
  switch(wVar1) {
  case L' ':
    wVar1 = L'\x15';
    break;
  case L'!':
  case L'#':
  case L'$':
  case L'%':
  case L'&':
  case L'(':
  case L')':
  case L'*':
  case L'+':
  case L',':
  case L'-':
  case L'.':
  case L'/':
  case L'8':
  case L'9':
  case L':':
  case L';':
  case L'=':
    goto switchD_0021927c_caseD_21;
  case L'\"':
  case L'\'':
    if (wVar1 == qu && triple != 0) {
      while (wVar1 = utf8_ptr::getch(p), wVar1 == qu) {
        utf8_ptr::setch(dst,qu);
        utf8_ptr::inc(p);
      }
      return;
    }
    break;
  case L'0':
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
    iVar4 = 3;
    wVar1 = L'\0';
    while (((bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5 &&
            (wVar2 = utf8_ptr::getch(p), (wVar2 & 0xfffffff8U) == 0x30)) &&
           (wVar2 = wVar2 + wVar1 * 8 + L'\xffffffd0', wVar2 < L'Ā'))) {
      utf8_ptr::inc(p);
      wVar1 = wVar2;
    }
    goto LAB_002192df;
  case L'<':
  case L'>':
    break;
  default:
    switch(wVar1) {
    case L'n':
      wVar1 = L'\n';
      break;
    case L'r':
      wVar1 = L'\r';
      break;
    case L't':
      wVar1 = L'\t';
      break;
    case L'u':
      wVar1 = L'\0';
      iVar4 = 4;
      while( true ) {
        utf8_ptr::inc(p);
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) break;
        wVar2 = utf8_ptr::getch(p);
        iVar3 = is_xdigit(wVar2);
        if (iVar3 == 0) break;
        iVar3 = -0x30;
        if (L'@' < wVar2) {
          iVar3 = -0x37;
        }
        if (L'`' < wVar2) {
          iVar3 = -0x57;
        }
        wVar1 = wVar1 * 0x10 + wVar2 + iVar3;
      }
      goto LAB_002192df;
    case L'v':
      wVar1 = L'\x0e';
      break;
    case L'x':
      wVar1 = L'\0';
      iVar4 = 2;
      while( true ) {
        utf8_ptr::inc(p);
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) break;
        wVar2 = utf8_ptr::getch(p);
        iVar3 = is_xdigit(wVar2);
        if (iVar3 == 0) break;
        iVar3 = -0x30;
        if (L'@' < wVar2) {
          iVar3 = -0x37;
        }
        if (L'`' < wVar2) {
          iVar3 = -0x57;
        }
        wVar1 = wVar1 * 0x10 + wVar2 + iVar3;
      }
LAB_002192df:
      utf8_ptr::setch(dst,wVar1);
      return;
    default:
      if (wVar1 == L'\\') break;
      if (wVar1 == L'^') {
        wVar1 = L'\x0f';
        break;
      }
      if (wVar1 == L'b') {
        wVar1 = L'\v';
        break;
      }
    case L'o':
    case L'p':
    case L'q':
    case L's':
    case L'w':
switchD_0021927c_caseD_21:
      log_pedantic(0x2752,(ulong)(uint)wVar1);
      utf8_ptr::setch(dst,L'\\');
    }
  }
  utf8_ptr::setch(dst,wVar1);
  utf8_ptr::inc(p);
  return;
}

Assistant:

void CTcTokenizer::xlat_escape(utf8_ptr *dst, utf8_ptr *p,
                               wchar_t qu, int triple)
{
    int i, acc;
    
    /* get the character after the escape */
    p->inc();
    wchar_t cur = p->getch();

    /* see what we have */
    switch(cur)
    {
    case '^':
        /* caps - 0x000F */
        cur = 0x000F;
        break;
        
    case '"':
    case '\'':
        /* 
         *   If we're in triple-quote mode, and this is the matching quote, a
         *   single backslash escapes a whole run of consecutive quotes, so
         *   skip the whole run.  
         */
        if (triple && cur == qu)
        {
            /* copy and skip all consecutive quotes */
            for ( ; p->getch() == qu ; dst->setch(cur), p->inc()) ;
            
            /* we're done */
            return;
        }
        break;
        
    case 'v':
        /* miniscules - 0x000E */
        cur = 0x000E;
        break;
        
    case 'b':
        /* blank line - 0x000B */
        cur = 0x000B;
        break;
        
    case ' ':
        /* quoted space - 0x0015 */
        cur = 0x0015;
        break;

    case 'n':
        /* newline - explicitly use Unicode 10 character */
        cur = 10;
        break;

    case 'r':
        /* return - explicitly use Unicode 13 character */
        cur = 13;
        break;

    case 't':
        /* tab - explicitly use Unicode 9 character */
        cur = 9;
        break;

    case 'u':
        /* 
         *   Hex unicode character number.  Read up to 4 hex digits that
         *   follow the 'u', and use that as a Unicode character ID.  
         */
        for (i = 0, acc = 0, p->inc() ; i < 4 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* we've already skipped ahead to the next character, so we're done */
        return;
        
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
        /* 
         *   Octal ASCII character number.  Accumulate up to three octal
         *   numbers, and use the result as a character ID. 
         */
        for (i = 0, acc = 0 ; i < 3 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another digit, and it would leave our result in the
             *   0-255 range, count it; if not, we're done 
             */
            if (is_odigit(cur))
            {
                /* compute the new value */
                long new_acc = 8*acc + value_of_odigit(cur);
                
                /* if this would be too high, don't count it */
                if (new_acc > 255)
                    break;
                else
                    acc = new_acc;
            }
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;

    case 'x':
        /* 
         *   Hex ASCII character number.  Read up to two hex digits as a
         *   character number.
         */
        for (i = 0, acc = 0, p->inc() ; i < 2 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;
        
    case '<':
    case '>':
    case '\\':
        /* just copy these literally */
        break;
        
    default:
        /* log a pedantic error */
        log_pedantic(TCERR_BACKSLASH_SEQ, cur);
        
        /* copy anything else as-is, including the backslash */
        dst->setch('\\');
        break;
    }

    /* set the output character */
    dst->setch(cur);

    /* skip the current character */
    p->inc();
}